

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

void dxil_spv::CFGStructurizer::merge_to_succ(CFGNode *node,uint index)

{
  pointer *pppCVar1;
  CFGNode *pCVar2;
  iterator __position;
  CFGNode *local_10;
  
  pCVar2 = (node->succ).
           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           ._M_impl.super__Vector_impl_data._M_start[index];
  __position._M_current =
       *(pointer *)
        ((long)&(pCVar2->headers).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl + 8);
  local_10 = node;
  if (__position._M_current ==
      *(pointer *)
       ((long)&(pCVar2->headers).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl + 0x10)) {
    std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
    _M_realloc_insert<dxil_spv::CFGNode*const&>
              ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>> *)
               &pCVar2->headers,__position,&local_10);
  }
  else {
    *__position._M_current = node;
    pppCVar1 = (pointer *)
               ((long)&(pCVar2->headers).
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl + 8);
    *pppCVar1 = *pppCVar1 + 1;
  }
  local_10->selection_merge_block =
       (local_10->succ).
       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
       ._M_impl.super__Vector_impl_data._M_start[index];
  local_10->merge = Selection;
  return;
}

Assistant:

void CFGStructurizer::merge_to_succ(CFGNode *node, unsigned index)
{
	node->succ[index]->headers.push_back(node);
	node->selection_merge_block = node->succ[index];
	node->merge = MergeType::Selection;
	//LOGI("Fixup selection merge %s -> %s\n", node->name.c_str(), node->selection_merge_block->name.c_str());
}